

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O1

Result __thiscall
wabt::anon_unknown_67::BinaryReaderIR::OnIfExceptExpr
          (BinaryReaderIR *this,Type sig_type,Index except_index)

{
  char *__s;
  Offset OVar1;
  Expr *pEVar2;
  Result RVar3;
  size_t sVar4;
  pointer __p;
  undefined1 auStack_a8 [8];
  Location loc;
  _Head_base<0UL,_wabt::Expr_*,_false> local_40;
  Expr *local_38;
  unique_ptr<wabt::IfExceptExpr,_std::default_delete<wabt::IfExceptExpr>_> expr;
  
  MakeUnique<wabt::IfExceptExpr>();
  loc.filename.size_._0_4_ = 0;
  loc.filename.size_._4_4_ = 0;
  loc.field_1.field_0.line = 0;
  auStack_a8 = (undefined1  [8])0x0;
  loc.filename.data_._0_4_ = 0;
  loc.filename.data_._4_4_ = 0;
  __s = this->filename_;
  sVar4 = strlen(__s);
  loc.filename.data_._0_4_ = (undefined4)sVar4;
  loc.filename.data_._4_4_ = (undefined4)(sVar4 >> 0x20);
  OVar1 = ((this->super_BinaryReaderNop).super_BinaryReaderDelegate.state)->offset;
  loc.filename.size_._0_4_ = (undefined4)OVar1;
  loc.filename.size_._4_4_ = (undefined4)(OVar1 >> 0x20);
  auStack_a8 = (undefined1  [8])__s;
  Var::Var((Var *)((long)&loc.field_1 + 8),except_index,(Location *)auStack_a8);
  Var::operator=((Var *)&local_38[5].super_intrusive_list_base<wabt::Expr>.prev_,
                 (Var *)((long)&loc.field_1 + 8));
  Var::~Var((Var *)((long)&loc.field_1 + 8));
  SetBlockDeclaration(this,(BlockDeclaration *)&local_38[1].loc.filename.size_,sig_type);
  pEVar2 = local_38;
  local_38 = (Expr *)0x0;
  local_40._M_head_impl = pEVar2;
  RVar3 = AppendExpr(this,(unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)&local_40);
  if (local_40._M_head_impl != (Expr *)0x0) {
    (*(local_40._M_head_impl)->_vptr_Expr[1])();
  }
  local_40._M_head_impl = (Expr *)0x0;
  if (RVar3.enum_ != Error) {
    PushLabel(this,IfExcept,(ExprList *)&pEVar2[3].loc.filename.size_,(Expr *)0x0);
  }
  if (local_38 != (Expr *)0x0) {
    (**(code **)(*(long *)local_38 + 8))();
  }
  return (Result)(uint)(RVar3.enum_ == Error);
}

Assistant:

Result BinaryReaderIR::OnIfExceptExpr(Type sig_type, Index except_index) {
  auto expr = MakeUnique<IfExceptExpr>();
  expr->except_var = Var(except_index, GetLocation());
  SetBlockDeclaration(&expr->true_.decl, sig_type);
  ExprList* expr_list = &expr->true_.exprs;
  CHECK_RESULT(AppendExpr(std::move(expr)));
  PushLabel(LabelType::IfExcept, expr_list);
  return Result::Ok;
}